

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.cpp
# Opt level: O1

void __thiscall rw::BBox::addPoint(BBox *this,V3d *point)

{
  float32 *pfVar1;
  float fVar2;
  
  if ((float)point->x < (float)(this->inf).x) {
    (this->inf).x = point->x;
  }
  if ((float)point->y < (float)(this->inf).y) {
    (this->inf).y = point->y;
  }
  if ((float)point->z < (float)(this->inf).z) {
    (this->inf).z = point->z;
  }
  fVar2 = (float)point->x;
  if ((float)(this->sup).x <= fVar2 && fVar2 != (float)(this->sup).x) {
    (this->sup).x = (float32)fVar2;
  }
  fVar2 = (float)point->y;
  pfVar1 = &(this->sup).y;
  if ((float)*pfVar1 <= fVar2 && fVar2 != (float)*pfVar1) {
    (this->sup).y = (float32)fVar2;
  }
  fVar2 = (float)point->z;
  pfVar1 = &(this->sup).z;
  if ((float)*pfVar1 <= fVar2 && fVar2 != (float)*pfVar1) {
    (this->sup).z = (float32)fVar2;
  }
  return;
}

Assistant:

void
BBox::addPoint(V3d *point)
{
	if(point->x < this->inf.x)
		this->inf.x = point->x;
	if(point->y < this->inf.y)
		this->inf.y = point->y;
	if(point->z < this->inf.z)
		this->inf.z = point->z;
	if(point->x > this->sup.x)
		this->sup.x = point->x;
	if(point->y > this->sup.y)
		this->sup.y = point->y;
	if(point->z > this->sup.z)
		this->sup.z = point->z;
}